

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OstreamBuffer.cpp
# Opt level: O0

ssize_t __thiscall
binlog::detail::OstreamBuffer::write(OstreamBuffer *this,int __fd,void *__buf,size_t __n)

{
  OstreamBuffer *pOVar1;
  size_type n;
  unsigned_long *puVar2;
  undefined4 in_register_00000034;
  size_t wsize;
  OstreamBuffer *this_00;
  void *local_18;
  OstreamBuffer *local_10;
  OstreamBuffer *local_8;
  
  pOVar1 = this;
  local_10 = (OstreamBuffer *)CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  for (local_18 = __buf; local_18 != (void *)0x0;
      local_18 = (void *)((long)local_18 - (long)this_00)) {
    n = std::array<char,_1024UL>::size(&this->_buf);
    puVar2 = std::min<unsigned_long>
                       ((unsigned_long *)&local_18,(unsigned_long *)&stack0xffffffffffffffd8);
    this_00 = (OstreamBuffer *)*puVar2;
    reserve(this_00,n);
    memcpy(this->_p,local_10,(size_t)this_00);
    this->_p = this->_p + (long)(&this_00->_buf + -1) + 0x3f8;
    pOVar1 = (OstreamBuffer *)((local_10->_buf)._M_elems + (long)(&this_00->_buf + -1) + 0x3f0);
    local_10 = pOVar1;
  }
  return (ssize_t)pOVar1;
}

Assistant:

void OstreamBuffer::write(const char* buf, std::size_t size)
{
  while (size != 0)
  {
    const std::size_t wsize = (std::min)(size, _buf.size());
    reserve(wsize);
    memcpy(_p, buf, wsize);
    _p += wsize;
    size -= wsize;
    buf += wsize;
  }
}